

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

int32_t getShortestSubtagLength(char *localeID)

{
  bool bVar1;
  size_t sVar2;
  int local_20;
  int iStack_1c;
  UBool reset;
  int32_t i;
  int32_t tmpLength;
  int32_t length;
  int32_t localeIDLength;
  char *localeID_local;
  
  sVar2 = strlen(localeID);
  iStack_1c = 0;
  bVar1 = true;
  i = (int)sVar2;
  for (local_20 = 0; local_20 < (int)sVar2; local_20 = local_20 + 1) {
    if ((localeID[local_20] == '_') || (localeID[local_20] == '-')) {
      if ((iStack_1c != 0) && (iStack_1c < i)) {
        i = iStack_1c;
      }
      bVar1 = true;
    }
    else {
      if (bVar1) {
        iStack_1c = 0;
        bVar1 = false;
      }
      iStack_1c = iStack_1c + 1;
    }
  }
  return i;
}

Assistant:

static int32_t getShortestSubtagLength(const char *localeID) {
    int32_t localeIDLength = static_cast<int32_t>(uprv_strlen(localeID));
    int32_t length = localeIDLength;
    int32_t tmpLength = 0;
    int32_t i;
    UBool reset = TRUE;

    for (i = 0; i < localeIDLength; i++) {
        if (localeID[i] != '_' && localeID[i] != '-') {
            if (reset) {
                tmpLength = 0;
                reset = FALSE;
            }
            tmpLength++;
        } else {
            if (tmpLength != 0 && tmpLength < length) {
                length = tmpLength;
            }
            reset = TRUE;
        }
    }

    return length;
}